

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test::
TestBody(SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test *this)

{
  bool bVar1;
  const_reference __t;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_00;
  HistoryTrackerMock *this_01;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_02;
  Cards *this_03;
  char *message;
  char *in_R9;
  string local_108;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  StrictMock<solitaire::archivers::SnapshotMock> *local_b8;
  StrictMock<solitaire::archivers::SnapshotMock> *local_b0;
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  local_a8;
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  local_90;
  undefined1 local_70 [16];
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
  local_60;
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  local_50;
  InSequence local_1d;
  undefined1 local_1c [7];
  InSequence seq;
  optional<solitaire::cards::Card> cardToAdd;
  SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test *this_local;
  
  __t = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                  ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                   (anonymous_namespace)::oneCard);
  std::optional<solitaire::cards::Card>::optional<const_solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)local_1c,__t);
  testing::InSequence::InSequence(&local_1d);
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::FoundationPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock,
             &(this->super_SolitaireHandWithOneCardAddCardTest).snapshotMock2);
  SolitaireEmptyHandTest::expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock,
             (optional<solitaire::cards::Card> *)local_1c);
  this_00 = SolitaireEmptyHandTest::expectMoveOperationSnapshotCreation
                      ((SolitaireEmptyHandTest *)this,
                       &(this->super_SolitaireHandWithOneCardAddCardTest).snapshotMock2);
  mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::make_unique
            ((mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_> *)local_70);
  testing::
  ByMove<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>
            ((testing *)(local_70 + 8),
             (unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
              *)local_70);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>>
            ((testing *)&local_60,
             (ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
              *)(local_70 + 8));
  testing::internal::ReturnAction::operator_cast_to_Action(&local_50,(ReturnAction *)&local_60);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::WillOnce(this_00,&local_50);
  testing::
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::~Action(&local_50);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
  ::~ReturnAction(&local_60);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
  ::~ByMoveWrapper((ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
                    *)(local_70 + 8));
  std::
  unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ::~unique_ptr((unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                 *)local_70);
  this_01 = &mock_ptr<testing::StrictMock<solitaire::archivers::HistoryTrackerMock>_>::operator*
                       (&(this->super_SolitaireHandWithOneCardAddCardTest).
                         super_SolitaireHandWithOneCardTest.super_SolitaireEmptyHandTest.
                         super_SolitaireTest.historyTrackerMock)->super_HistoryTrackerMock;
  local_b8 = mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::get
                       (&(this->super_SolitaireHandWithOneCardAddCardTest).moveOperationSnapshot);
  local_b0 = (StrictMock<solitaire::archivers::SnapshotMock> *)
             testing::no_adl::Pointer<testing::StrictMock<solitaire::archivers::SnapshotMock>*>
                       (&local_b8);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_a8,(PointerMatcher *)&local_b0)
  ;
  archivers::HistoryTrackerMock::gmock_save(&local_90,this_01,&local_a8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            ::operator()(&local_90,
                         (WithoutMatchers *)
                         ((long)&gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),(void *)0x0);
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1f1,"*historyTrackerMock","save(Pointer(moveOperationSnapshot.get()))");
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::~MockSpec(&local_90);
  testing::
  Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~Matcher(&local_a8);
  piles::PileId::PileId
            ((PileId *)&gtest_ar_.message_,(PileId *)&(anonymous_namespace)::lastFoundationPileId);
  Solitaire::tryAddCardOnFoundationPile
            (&(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
              super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire,
             (PileId *)&gtest_ar_.message_);
  this_03 = Solitaire::getCardsInHand
                      (&(this->super_SolitaireHandWithOneCardAddCardTest).
                        super_SolitaireHandWithOneCardTest.super_SolitaireEmptyHandTest.
                        super_SolitaireTest.solitaire);
  local_d1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (this_03);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_d0,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,500,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::InSequence::~InSequence(&local_1d);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, addCardOnFoundationPileWithHistoryRecord) {
    std::optional<Card> cardToAdd {oneCard.back()};

    InSequence seq;
    expectSnapshotCreation(lastFoundationPileMock, snapshotMock2);
    expectTryingAddCardAndClearIt(lastFoundationPileMock, cardToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}